

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

void __thiscall xe::xml::Parser::Parser(Parser *this)

{
  Parser *this_local;
  
  Tokenizer::Tokenizer(&this->m_tokenizer);
  this->m_element = ELEMENT_INCOMPLETE;
  std::__cxx11::string::string((string *)&this->m_elementName);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_attributes);
  this->m_state = STATE_DATA;
  std::__cxx11::string::string((string *)&this->m_attribName);
  std::__cxx11::string::string((string *)&this->m_entityValue);
  return;
}

Assistant:

Parser::Parser (void)
	: m_element		(ELEMENT_INCOMPLETE)
	, m_state		(STATE_DATA)
{
}